

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_perhapsrewind(connectdata *conn)

{
  Curl_HttpReq CVar1;
  SessionHandle *data_00;
  void *pvVar2;
  long lVar3;
  size_t local_38;
  curl_off_t expectsend;
  curl_off_t bytessent;
  HTTP *http;
  SessionHandle *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  pvVar2 = (data_00->req).protop;
  local_38 = 0xffffffffffffffff;
  if (pvVar2 == (void *)0x0) {
    conn_local._4_4_ = CURLE_OK;
  }
  else if (((data_00->set).httpreq | HTTPREQ_PUT) == HTTPREQ_HEAD) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    lVar3 = *(long *)((long)pvVar2 + 0x30);
    if (((conn->bits).authneg & 1U) == 0) {
      CVar1 = (data_00->set).httpreq;
      if (CVar1 == HTTPREQ_POST) {
        if ((data_00->set).postfieldsize == -1) {
          if ((data_00->set).postfields != (void *)0x0) {
            local_38 = strlen((char *)(data_00->set).postfields);
          }
        }
        else {
          local_38 = (data_00->set).postfieldsize;
        }
      }
      else if (CVar1 == HTTPREQ_POST_FORM) {
        local_38 = *(size_t *)((long)pvVar2 + 8);
      }
      else if ((CVar1 == HTTPREQ_PUT) && ((data_00->state).infilesize != -1)) {
        local_38 = (data_00->state).infilesize;
      }
    }
    else {
      local_38 = 0;
    }
    (conn->bits).rewindaftersend = false;
    if ((local_38 == 0xffffffffffffffff) || (lVar3 < (long)local_38)) {
      if (((data_00->state).authproxy.picked == 8) ||
         ((((data_00->state).authhost.picked == 8 || ((data_00->state).authproxy.picked == 0x20)) ||
          ((data_00->state).authhost.picked == 0x20)))) {
        if ((((long)(local_38 - lVar3) < 2000) || ((conn->ntlm).state != NTLMSTATE_NONE)) ||
           ((conn->proxyntlm).state != NTLMSTATE_NONE)) {
          if (((conn->bits).authneg & 1U) == 0) {
            (conn->bits).rewindaftersend = true;
            Curl_infof(data_00,"Rewind stream after send\n");
          }
          return CURLE_OK;
        }
        if (((conn->bits).close & 1U) != 0) {
          return CURLE_OK;
        }
        Curl_infof(data_00,"NTLM send, close instead of sending %ld bytes\n",local_38 - lVar3);
      }
      (conn->bits).close = true;
      (data_00->req).size = 0;
    }
    if (lVar3 == 0) {
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      conn_local._4_4_ = Curl_readrewind(conn);
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode http_perhapsrewind(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  struct HTTP *http = data->req.protop;
  curl_off_t bytessent;
  curl_off_t expectsend = -1; /* default is unknown */

  if(!http)
    /* If this is still NULL, we have not reach very far and we can safely
       skip this rewinding stuff */
    return CURLE_OK;

  switch(data->set.httpreq) {
  case HTTPREQ_GET:
  case HTTPREQ_HEAD:
    return CURLE_OK;
  default:
    break;
  }

  bytessent = http->writebytecount;

  if(conn->bits.authneg)
    /* This is a state where we are known to be negotiating and we don't send
       any data then. */
    expectsend = 0;
  else {
    /* figure out how much data we are expected to send */
    switch(data->set.httpreq) {
    case HTTPREQ_POST:
      if(data->set.postfieldsize != -1)
        expectsend = data->set.postfieldsize;
      else if(data->set.postfields)
        expectsend = (curl_off_t)strlen(data->set.postfields);
      break;
    case HTTPREQ_PUT:
      if(data->state.infilesize != -1)
        expectsend = data->state.infilesize;
      break;
    case HTTPREQ_POST_FORM:
      expectsend = http->postsize;
      break;
    default:
      break;
    }
  }

  conn->bits.rewindaftersend = FALSE; /* default */

  if((expectsend == -1) || (expectsend > bytessent)) {
    /* There is still data left to send */
    if((data->state.authproxy.picked == CURLAUTH_NTLM) ||
       (data->state.authhost.picked == CURLAUTH_NTLM) ||
       (data->state.authproxy.picked == CURLAUTH_NTLM_WB) ||
       (data->state.authhost.picked == CURLAUTH_NTLM_WB)) {
      if(((expectsend - bytessent) < 2000) ||
         (conn->ntlm.state != NTLMSTATE_NONE) ||
         (conn->proxyntlm.state != NTLMSTATE_NONE)) {
        /* The NTLM-negotiation has started *OR* there is just a little (<2K)
           data left to send, keep on sending. */

        /* rewind data when completely done sending! */
        if(!conn->bits.authneg) {
          conn->bits.rewindaftersend = TRUE;
          infof(data, "Rewind stream after send\n");
        }

        return CURLE_OK;
      }
      if(conn->bits.close)
        /* this is already marked to get closed */
        return CURLE_OK;

      infof(data, "NTLM send, close instead of sending %"
            CURL_FORMAT_CURL_OFF_T " bytes\n",
            (curl_off_t)(expectsend - bytessent));
    }

    /* This is not NTLM or many bytes left to send: close
     */
    connclose(conn, "Mid-auth HTTP and much data left to send");
    data->req.size = 0; /* don't download any more than 0 bytes */

    /* There still is data left to send, but this connection is marked for
       closure so we can safely do the rewind right now */
  }

  if(bytessent)
    /* we rewind now at once since if we already sent something */
    return Curl_readrewind(conn);

  return CURLE_OK;
}